

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void SortSetHelper(StringItem *list,Var item,uint32 index,JsReentLock *jsReentLock,
                  ScriptContext *scriptContext)

{
  JavascriptString *ptr;
  undefined1 auStack_68 [8];
  JsReentLock lock;
  undefined1 local_40 [8];
  StringItem current;
  ScriptContext *scriptContext_local;
  JsReentLock *jsReentLock_local;
  uint32 index_local;
  Var item_local;
  StringItem *list_local;
  
  current.StringValue.ptr = (JavascriptString *)scriptContext;
  StringItem::StringItem((StringItem *)local_40);
  Memory::WriteBarrierPtr<void>::operator=((WriteBarrierPtr<void> *)local_40,item);
  auStack_68 = (undefined1  [8])jsReentLock->m_threadContext;
  lock.m_threadContext = (ThreadContext *)jsReentLock->m_arrayObject;
  lock.m_arrayObject = jsReentLock->m_arrayObject2;
  lock.m_arrayObject2 = *(Var *)&jsReentLock->m_savedNoJsReentrancy;
  JsReentLock::unlock((JsReentLock *)auStack_68);
  ptr = Js::JavascriptConversion::ToString(item,current.StringValue.ptr);
  Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
            ((WriteBarrierPtr<Js::JavascriptString> *)&current,ptr);
  JsReentLock::MutateArrayObject((JsReentLock *)auStack_68);
  JsReentLock::relock((JsReentLock *)auStack_68);
  StringItem::operator=(list + index,(StringItem *)local_40);
  JsReentLock::~JsReentLock((JsReentLock *)auStack_68);
  return;
}

Assistant:

inline void SortSetHelper(StringItem* list, Var item, uint32 index, JsReentLock* jsReentLock, ScriptContext* scriptContext)
    {
        StringItem current;
        current.Value = item;
        JsReentLock lock = *jsReentLock;
        JS_REENTRANT(lock, current.StringValue = JavascriptConversion::ToString(item, scriptContext));
        list[index] = current;
    }